

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# steed.c
# Opt level: O3

int doride(void)

{
  monst *pmVar1;
  char cVar2;
  boolean bVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  obj *poVar7;
  trap *ptVar8;
  char *pcVar9;
  permonst *ppVar10;
  monst *mon;
  char *pcVar11;
  bool bVar12;
  schar dy;
  schar dx;
  schar dz;
  char buf [256];
  char local_14a;
  char local_149;
  permonst *local_148;
  schar local_139;
  char local_138 [264];
  
  if (u.usteed != (monst *)0x0) {
    dismount_steed(6);
    return 1;
  }
  iVar4 = getdir((char *)0x0,&local_149,&local_14a,&local_139);
  if (iVar4 == 0) {
    return 0;
  }
  if (0x4e < ((int)u.ux + (int)local_149) - 1U) {
    return 0;
  }
  if (0x14 < (uint)((int)local_14a + (int)u.uy)) {
    return 0;
  }
  if (flags.debug == '\0') {
    bVar12 = false;
  }
  else {
    cVar2 = yn_function("Force the mount to succeed?","yn",'n');
    bVar12 = cVar2 == 'y';
  }
  pmVar1 = level->monsters[(long)local_149 + (long)u.ux][(long)local_14a + (long)u.uy];
  mon = (monst *)0x0;
  if ((pmVar1 != (monst *)0x0) && ((pmVar1->field_0x61 & 2) == 0)) {
    mon = pmVar1;
  }
  if (u.usteed != (monst *)0x0) {
    pcVar6 = mon_nam(u.usteed);
    pcVar11 = "You are already riding %s.";
    goto LAB_00257f16;
  }
  if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
    if (u.umonnum == u.umonster) {
      if (!bVar12) {
LAB_0025817e:
        pcVar6 = "Maybe you should find a designated driver.";
        goto LAB_002582f0;
      }
    }
    else {
      bVar3 = dmgtype(youmonst.data,0x24);
      if (bVar3 == '\0' && !bVar12) goto LAB_0025817e;
    }
  }
  if (u.uprops[0x20].extrinsic != 0 || u.uprops[0x20].intrinsic != 0) {
    pcVar6 = body_part(9);
    pcVar6 = makeplural(pcVar6);
    pline("Your %s are in no shape for riding.",pcVar6);
    if (!bVar12) {
      return 0;
    }
    if (flags.debug == '\0') {
      return 0;
    }
    cVar2 = yn_function("Heal your legs?","yn",'n');
    if (cVar2 != 'y') {
      return 0;
    }
    u.uprops[0x20].extrinsic = 0;
    u.uprops[0x20].intrinsic = 0;
  }
  if ((u.umonnum != u.umonster) &&
     (((((youmonst.data)->mflags1 >> 0x11 & 1) == 0 || (((youmonst.data)->mflags1 >> 0x13 & 1) != 0)
       ) || (1 < (byte)((youmonst.data)->msize - 1))))) {
    pcVar6 = "You won\'t fit on a saddle.";
    goto LAB_002582f0;
  }
  if (bVar12) {
    if (mon != (monst *)0x0) goto LAB_00258003;
  }
  else {
    iVar4 = near_capacity();
    if (1 < iVar4) {
      pcVar6 = "You can\'t do that while carrying so much stuff.";
      goto LAB_002582f0;
    }
    if (mon == (monst *)0x0) goto LAB_002582e9;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_002581dc;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_002581d7;
    }
    else {
LAB_002581d7:
      if (ublindf != (obj *)0x0) {
LAB_002581dc:
        if (ublindf->oartifact == '\x1d') goto LAB_002582d6;
      }
      if ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
           (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
           youmonst.data != mons + 0x32) || (u.uprops[0x19].blocked != 0)) goto LAB_002582e9;
    }
LAB_002582d6:
    if (((mon->field_0x60 & 0x80) == 0) && (1 < (byte)(mon->m_ap_type - 1))) {
LAB_00258003:
      if (((uball != (obj *)0x0 || u.utrap != 0) ||
           (u.ustuck != (monst *)0x0 || (u._1052_1_ & 1) != 0)) ||
         (bVar3 = test_move((int)u.ux,(int)u.uy,(int)mon->mx - (int)u.ux,(int)mon->my - (int)u.uy,0,
                            1), bVar3 == '\0')) {
        if ((uball != (obj *)0x0) ||
           ((((u._1052_1_ & 1) == 0 && (u.ustuck == (monst *)0x0)) && (u.utrap == 0)))) {
          pcVar6 = body_part(9);
          pcVar11 = "You are unable to swing your %s over.";
          goto LAB_00257f16;
        }
        pcVar6 = "You are stuck here for now.";
        goto LAB_002582f0;
      }
      poVar7 = which_armor(mon,0x100000);
      if (poVar7 == (obj *)0x0) {
        pcVar6 = Monnam(mon);
        pcVar11 = "%s is not saddled.";
        goto LAB_00257f16;
      }
      ppVar10 = mon->data;
      if (((ppVar10 == mons + 0xc || ppVar10 == mons + 0xb) && (u.uprops[8].extrinsic == 0)) &&
         (((byte)youmonst.mintrinsics & 0x80) == 0)) {
        local_148 = ppVar10;
        pcVar6 = mon_nam(mon);
        pline("You touch %s.",pcVar6);
        pcVar6 = mons_mname(mon->data);
        pcVar6 = an(pcVar6);
        sprintf(local_138,"attempting to ride %s",pcVar6);
        bVar3 = delayed_petrify((char *)0x0,local_138);
        ppVar10 = local_148;
        if (bVar3 != '\0') {
          pline("You stop your mounting attempt.");
          return 1;
        }
      }
      cVar2 = mon->mtame;
      if ((cVar2 == '\0') || ((*(uint *)&mon->field_0x60 >> 0x1a & 1) != 0)) {
        pcVar6 = mon_nam(mon);
        pcVar11 = "I think %s would mind.";
        goto LAB_00257f16;
      }
      if ((*(uint *)&mon->field_0x60 >> 0x17 & 1) != 0) {
        ptVar8 = t_at(level,(int)mon->mx,(int)mon->my);
        pcVar11 = mon_nam(mon);
        iVar4 = pronoun_gender(level,mon);
        pcVar6 = genders[iVar4].he;
        pcVar9 = an(defexplain[(ulong)((byte)ptVar8->field_0x8 & 0x1f) + 0x2f]);
        pline("You can\'t mount %s while %s\'s trapped in %s.",pcVar11,pcVar6,pcVar9);
        return 0;
      }
      local_148 = ppVar10;
      if ((bVar12) || (urole.malenum == 0x15f)) {
        if (!bVar12) goto LAB_0025844a;
      }
      else {
        cVar2 = cVar2 + -1;
        mon->mtame = cVar2;
        if (cVar2 == '\0') {
          newsym((int)mon->mx,(int)mon->my);
          pcVar6 = Monnam(mon);
          pcVar11 = " and its leash comes off";
          if ((*(uint *)&mon->field_0x60 >> 0x18 & 1) == 0) {
            pcVar11 = "";
          }
          pline("%s resists%s!",pcVar6,pcVar11);
          if ((mon->field_0x63 & 1) != 0) {
            m_unleash(mon,'\0');
            return 0;
          }
          return 0;
        }
LAB_0025844a:
        if (((u._1052_1_ & 2) != 0) && ((ppVar10->mflags1 & 2) == 0)) {
          pcVar6 = "You can\'t ride that creature while under water.";
          goto LAB_002582f0;
        }
      }
      bVar3 = can_saddle(mon);
      if ((bVar3 != '\0') && (bVar3 = can_ride(mon), bVar3 != '\0')) {
        if (bVar12) {
LAB_00258489:
          u.usteed = mon;
          remove_monster(level,(int)mon->mx,(int)mon->my);
          teleds((int)mon->mx,(int)mon->my,'\x01');
          return 1;
        }
        if (((local_148->mlet == '\x05') || ((local_148->mflags1 & 1) != 0)) ||
           (((u.uprops[0x12].intrinsic == 0 && u.uprops[0x12].extrinsic == 0 ||
             (((u.uprops[0x12].extrinsic & 0xffffdfff) == 0 &&
              (u.uprops[0x12].intrinsic & 0xef000000) == 0) &&
              ((u.uprops[0x12].extrinsic & 0x2000) != 0 ||
              (u.uprops[0x12].intrinsic & 0x10000000) != 0))) && ((youmonst.data)->mlet != '\x05')))
           ) {
          if (((uarm != (obj *)0x0) &&
              ((ushort)((*(ushort *)&objects[uarm->otyp].field_0x11 >> 4 & 0x1f) - 0xb) < 7)) &&
             (uVar5 = *(uint *)&uarm->field_0x4a & 0x300,
             (*(uint *)&uarm->field_0x4a >> 10 & 3) != 0 || uVar5 != 0)) {
            pcVar6 = "rusty";
            if (uVar5 == 0) {
              pcVar6 = "corroded";
            }
            pcVar11 = mon_nam(mon);
            pline("Your %s armor is too stiff to be able to mount %s.",pcVar6,pcVar11);
            return 0;
          }
          if (((((u.uprops[0x1c].intrinsic == 0) && (u.uprops[0x25].intrinsic == 0)) &&
               ((u.uprops[0x25].extrinsic == 0 &&
                ((u.uprops[0x29].intrinsic == 0 && (u.uprops[0x20].intrinsic == 0)))))) &&
              (u.uprops[0x20].extrinsic == 0)) &&
             (((poVar7->field_0x4a & 1) == 0 &&
              (iVar4 = cVar2 + u.ulevel, uVar5 = mt_random(), (int)(uVar5 % 0x14) < iVar4)))) {
            if (((u.uprops[0x12].extrinsic != 0 || u.uprops[0x12].intrinsic != 0) ||
                ((youmonst.data)->mlet == '\x05')) &&
               ((local_148->mlet != '\x05' && ((local_148->mflags1 & 1) == 0)))) {
              pcVar6 = Monnam(mon);
              pline("%s magically floats up!",pcVar6);
            }
            pcVar6 = mon_nam(mon);
            pline("You mount %s.",pcVar6);
            goto LAB_00258489;
          }
          if ((u.uprops[0x12].extrinsic == 0 && u.uprops[0x12].intrinsic == 0) &&
             ((youmonst.data)->mlet != '\x05')) {
            pcVar6 = mon_nam(mon);
            pline("You slip while trying to get on %s.",pcVar6);
            pcVar6 = x_monnam(mon,2,(char *)0x0,7,'\x01');
            sprintf(local_138,"slipped while mounting %s",pcVar6);
            uVar5 = mt_random();
            losehp(uVar5 % 5 + 10,local_138,2);
            return 0;
          }
          pcVar6 = Monnam(mon);
          pcVar11 = "%s slips away from you.";
        }
        else {
          pcVar6 = mon_nam(mon);
          pcVar11 = "You cannot reach %s.";
        }
LAB_00257f16:
        pline(pcVar11,pcVar6);
        return 0;
      }
      pcVar6 = "You can\'t ride such a creature.";
      goto LAB_002582f0;
    }
  }
LAB_002582e9:
  pcVar6 = "I see nobody there.";
LAB_002582f0:
  pline(pcVar6);
  return 0;
}

Assistant:

int doride(void)
{
	boolean forcemount = FALSE;
	schar dx, dy, dz;

	if (u.usteed)
	    dismount_steed(DISMOUNT_BYCHOICE);
	else if (getdir(NULL, &dx, &dy, &dz) &&
	         isok(u.ux+dx, u.uy+dy)) {
	    if (wizard && yn("Force the mount to succeed?") == 'y')
		forcemount = TRUE;
	    return mount_steed(m_at(level, u.ux+dx, u.uy+dy), forcemount);
	} else
	    return 0;
	return 1;
}